

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

int lws_wsi_mux_mark_parents_needing_writeable(lws *wsi)

{
  byte bVar1;
  lws *plVar2;
  lws *plVar3;
  lws *plVar4;
  lws *plVar5;
  
  plVar2 = (lws *)(*(ulong *)&wsi->field_0x2dc & 0x80000000000002);
  plVar5 = wsi;
  plVar4 = wsi;
  while (plVar3 = plVar5, plVar2 != (lws *)0x0) {
    plVar2 = (plVar3->mux).parent_wsi;
    plVar5 = plVar2;
    plVar4 = plVar3;
  }
  bVar1 = (plVar4->mux).requested_POLLOUT;
  do {
    (wsi->mux).requested_POLLOUT = '\x01';
    _lws_log(8,"%s: mark %p (sid %u) pending writable\n",
             "lws_wsi_mux_mark_parents_needing_writeable",wsi,(ulong)(wsi->mux).my_sid);
    wsi = (wsi->mux).parent_wsi;
  } while (wsi != (lws *)0x0);
  return (uint)bVar1;
}

Assistant:

int
lws_wsi_mux_mark_parents_needing_writeable(struct lws *wsi)
{
	struct lws *network_wsi = lws_get_network_wsi(wsi), *wsi2;
	int already = network_wsi->mux.requested_POLLOUT;

	/* mark everybody above him as requesting pollout */

	wsi2 = wsi;
	while (wsi2) {
		wsi2->mux.requested_POLLOUT = 1;
		lwsl_info("%s: mark %p (sid %u) pending writable\n", __func__,
				wsi2, wsi2->mux.my_sid);
		wsi2 = wsi2->mux.parent_wsi;
	}

	return already;
}